

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndColumns(void)

{
  ImVector<ImGuiColumnData> *this;
  ImGuiWindow *pIVar1;
  ImGuiColumns *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 col;
  int iVar5;
  ImGuiColumnData *pIVar6;
  int n_1;
  int i;
  int n;
  int iVar7;
  ulong uVar8;
  ImGuiCol idx;
  ImGuiID id;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  undefined1 local_a8 [16];
  ulong local_98;
  ImGuiContext *g;
  ImVec2 local_88;
  ImVec2 local_80;
  ImRect column_hit_rect;
  
  g = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  pIVar2 = (pIVar1->DC).CurrentColumns;
  if (pIVar2 == (ImGuiColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x21c0,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  if (1 < pIVar2->Count) {
    PopClipRect();
    ImDrawList::ChannelsMerge(pIVar1->DrawList);
  }
  fVar11 = (pIVar1->DC).CursorPos.y;
  uVar9 = -(uint)(fVar11 <= pIVar2->LineMaxY);
  fVar11 = (float)(~uVar9 & (uint)fVar11 | (uint)pIVar2->LineMaxY & uVar9);
  pIVar2->LineMaxY = fVar11;
  (pIVar1->DC).CursorPos.y = fVar11;
  uVar9 = pIVar2->Flags;
  if ((uVar9 & 0x10) == 0) {
    (pIVar1->DC).CursorMaxPos.x = pIVar2->BackupCursorMaxPosX;
  }
  if (((uVar9 & 1) == 0) && (pIVar1->SkipItems == false)) {
    fVar12 = (pIVar1->ClipRect).Min.y;
    uVar9 = -(uint)(fVar12 <= pIVar2->BackupCursorPosY);
    fVar10 = (pIVar1->ClipRect).Max.y;
    if (fVar10 <= fVar11) {
      fVar11 = fVar10;
    }
    fVar12 = (float)(~uVar9 & (uint)fVar12 | (uint)pIVar2->BackupCursorPosY & uVar9);
    this = &pIVar2->Columns;
    local_98 = 0xffffffffffffffff;
    uVar8 = 1;
    while( true ) {
      iVar5 = pIVar2->Count;
      iVar7 = (int)uVar8;
      if (iVar5 <= iVar7) break;
      pIVar6 = ImVector<ImGuiColumnData>::operator[](this,iVar7);
      local_a8._0_4_ = (pIVar1->Pos).x;
      fVar10 = GetColumnOffset(iVar7);
      local_a8._0_4_ = fVar10 + (float)local_a8._0_4_;
      id = pIVar2->ID + iVar7;
      column_hit_rect.Min.x = (float)local_a8._0_4_ + -4.0;
      local_a8._4_4_ = extraout_XMM0_Db;
      local_a8._8_4_ = extraout_XMM0_Dc;
      local_a8._12_4_ = extraout_XMM0_Dd;
      column_hit_rect.Max.x = (float)local_a8._0_4_ + 4.0;
      column_hit_rect.Min.y = fVar12;
      column_hit_rect.Max.y = fVar11;
      KeepAliveID(id);
      bVar4 = IsClippedEx(&column_hit_rect,id,false);
      if (!bVar4) {
        hovered = false;
        held = false;
        if ((pIVar2->Flags & 2) == 0) {
          ButtonBehavior(&column_hit_rect,id,&hovered,&held,0);
          if (hovered == false) {
            if ((held & 1U) != 0) {
              g->MouseCursor = 4;
              goto LAB_00121268;
            }
          }
          else {
            g->MouseCursor = 4;
            if ((held & 1U) != 0) {
LAB_00121268:
              if ((pIVar6->Flags & 2) == 0) {
                local_98 = uVar8;
              }
              local_98 = local_98 & 0xffffffff;
            }
          }
        }
        idx = hovered + 0x1b;
        if ((held & 1U) != 0) {
          idx = 0x1d;
        }
        col = GetColorU32(idx,1.0);
        local_88.x = (float)(int)(float)local_a8._0_4_;
        local_88.y = fVar11;
        local_80.x = local_88.x;
        local_80.y = fVar12 + 1.0;
        ImDrawList::AddLine(pIVar1->DrawList,&local_80,&local_88,col,1.0);
      }
      uVar8 = (ulong)(iVar7 + 1);
    }
    iVar7 = (int)local_98;
    if (iVar7 != -1) {
      if (pIVar2->IsBeingResized == false) {
        for (i = 0; i <= iVar5; i = i + 1) {
          pIVar6 = ImVector<ImGuiColumnData>::operator[](this,i);
          local_a8._0_4_ = pIVar6->OffsetNorm;
          pIVar6 = ImVector<ImGuiColumnData>::operator[](this,i);
          pIVar6->OffsetNormBeforeResize = (float)local_a8._0_4_;
          iVar5 = pIVar2->Count;
        }
      }
      pIVar2->IsBeingResized = true;
      pIVar3 = GImGui;
      if (iVar7 < 1) {
        __assert_fail("column_index > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                      ,0x2104,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
      }
      if (GImGui->ActiveId != pIVar2->ID + iVar7) {
        __assert_fail("g.ActiveId == columns->ID + ImGuiID(column_index)",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                      ,0x2105,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
      }
      local_a8 = ZEXT416((uint)((((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0)
                               - (GImGui->CurrentWindow->Pos).x));
      fVar11 = GetColumnOffset(iVar7 + -1);
      fVar11 = fVar11 + (pIVar3->Style).ColumnsMinSpacing;
      uVar9 = -(uint)(fVar11 <= (float)local_a8._0_4_);
      fVar11 = (float)(~uVar9 & (uint)fVar11 | local_a8._0_4_ & uVar9);
      if ((pIVar2->Flags & 4) != 0) {
        local_a8._4_4_ = local_a8._4_4_ & extraout_XMM0_Db_00;
        local_a8._0_4_ = fVar11;
        local_a8._8_4_ = local_a8._8_4_ & extraout_XMM0_Dc_00;
        local_a8._12_4_ = local_a8._12_4_ & extraout_XMM0_Dd_00;
        fVar12 = GetColumnOffset(iVar7 + 1);
        fVar12 = fVar12 - (pIVar3->Style).ColumnsMinSpacing;
        fVar11 = (float)local_a8._0_4_;
        if (fVar12 <= (float)local_a8._0_4_) {
          fVar11 = fVar12;
        }
      }
      SetColumnOffset(iVar7,fVar11);
    }
    bVar4 = iVar7 != -1;
  }
  else {
    bVar4 = false;
  }
  pIVar2->IsBeingResized = bVar4;
  (pIVar1->DC).CurrentColumns = (ImGuiColumns *)0x0;
  (pIVar1->DC).ColumnsOffset.x = 0.0;
  (pIVar1->DC).CursorPos.x = (float)(int)((pIVar1->Pos).x + (pIVar1->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        window->DrawList->ChannelsMerge();
    }

    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(columns->Flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->BackupCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    bool is_being_resized = false;
    if (!(columns->Flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->BackupCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(columns->Flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}